

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O0

void __thiscall Vector4f::Vector4f(Vector4f *this,float x,float y,Vector2f *zw)

{
  Vector2f *in_RSI;
  undefined4 *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar1;
  undefined4 in_XMM1_Da;
  
  *in_RDI = in_XMM0_Da;
  in_RDI[1] = in_XMM1_Da;
  fVar1 = Vector2f::x(in_RSI);
  in_RDI[2] = fVar1;
  fVar1 = Vector2f::y(in_RSI);
  in_RDI[3] = fVar1;
  return;
}

Assistant:

Vector4f::Vector4f( float x, float y, const Vector2f& zw )
{
	m_elements[0] = x;
	m_elements[1] = y;
	m_elements[2] = zw.x();
	m_elements[3] = zw.y();
}